

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  int iVar6;
  TRef TVar7;
  ulong uVar8;
  IRIns *pIVar9;
  IRRef1 *pIVar10;
  ulong uVar11;
  cTValue *pcVar12;
  IRIns *pIVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  TValue keyv;
  
  pIVar4 = (J->cur).ir;
  pIVar13 = pIVar4 + xref;
  uVar8 = (ulong)(J->fold).ins.field_1.o;
  pIVar10 = J->chain + uVar8 + 7;
  while( true ) {
    uVar16 = (uint)*pIVar10;
    uVar14 = (uint)*pIVar10;
    if (uVar14 <= xref) break;
    AVar5 = aa_ahref(J,pIVar13,pIVar4 + pIVar4[uVar14].field_0.op1);
    uVar15 = uVar16;
    if (AVar5 == ALIAS_MAY) goto LAB_0012f4c0;
    if (AVar5 == ALIAS_MUST) {
      return (uint)(&pIVar4->field_0)[uVar14].op2;
    }
    pIVar10 = &(&pIVar4->field_0)[uVar14].prev;
  }
  bVar1 = (pIVar13->field_1).o;
  pIVar9 = pIVar13;
  if ((bVar1 & 0xfe) == 0x38) {
    pIVar9 = pIVar4 + (pIVar13->field_0).op1;
  }
  uVar3 = (pIVar9->field_0).op1;
  cVar2 = *(char *)((long)pIVar4 + (ulong)uVar3 * 8 + 5);
  uVar15 = xref;
  if (((cVar2 == 'O') || ((cVar2 == 'P' && (-1 < (short)(pIVar13->field_0).op2)))) &&
     (iVar6 = fwd_aa_tab_clear(J,(uint)uVar3,(uint)uVar3), iVar6 != 0)) {
    if (bVar1 == 0x38) {
      pIVar10 = J->chain + 0x3b;
      do {
        if (*pIVar10 <= uVar3) goto LAB_0012f4e9;
        pIVar10 = (IRRef1 *)((ulong)*pIVar10 * 8 + 6 + (long)pIVar4);
      } while ((*(byte *)((long)pIVar4 + (ulong)pIVar10[-2] * 8 + 4) & 0x1f) != 0xe);
    }
    else {
      uVar11 = (ulong)(pIVar13->field_0).op2;
      if (*(char *)((long)pIVar4 + uVar11 * 8 + 5) == '\x1e') {
        uVar11 = (ulong)pIVar4[uVar11].field_0.op1;
      }
      if (((*(byte *)((long)pIVar4 + uVar11 * 8 + 4) & 0x1f) != 0xe) || (J->chain[0x3b] <= uVar3)) {
LAB_0012f4e9:
        do {
          if (uVar16 <= uVar3) goto LAB_0012f533;
          uVar11 = (ulong)uVar16;
          AVar5 = aa_ahref(J,pIVar13,pIVar4 + pIVar4[uVar11].field_0.op1);
          if (AVar5 == ALIAS_MAY) break;
          if (AVar5 == ALIAS_MUST) {
            return (uint)*(ushort *)((long)pIVar4 + uVar11 * 8 + 2);
          }
          uVar16 = (uint)*(ushort *)((long)pIVar4 + uVar11 * 8 + 6);
        } while( true );
      }
    }
  }
LAB_0012f4c0:
  pIVar10 = J->chain + uVar8;
  do {
    uVar3 = *pIVar10;
    if (uVar3 <= uVar15) {
      return 0;
    }
    pIVar13 = (J->cur).ir + uVar3;
    pIVar10 = &(pIVar13->field_0).prev;
  } while ((pIVar13->field_0).op1 != xref);
  return (uint)uVar3;
LAB_0012f533:
  if (cVar2 == 'O') {
    return 0x7fff;
  }
  pIVar13 = pIVar4 + (pIVar13->field_0).op2;
  if ((pIVar13->field_1).o == '\x1e') {
    pIVar13 = pIVar4 + (pIVar13->field_0).op1;
  }
  lj_ir_kvalue(J->L,&keyv,pIVar13);
  pcVar12 = lj_tab_get(J->L,(GCtab *)(ulong)(J->cur).ir[pIVar4[uVar3].field_0.op1].field_1.op12,
                       &keyv);
  uVar14 = (pcVar12->field_2).it;
  if (0xfffffffc < uVar14) {
    return ~uVar14 * 0xffffff + 0x7fff;
  }
  if (uVar14 < 0xfffeffff) {
    TVar7 = lj_ir_knum_u64(J,pcVar12->u64);
    return TVar7;
  }
  if (uVar14 + 0xd < 9) {
    TVar7 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar12->u32).lo,IRT_STR);
    return TVar7;
  }
  uVar8 = (ulong)(J->fold).ins.field_1.o;
  goto LAB_0012f4c0;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if ((ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) &&
	fwd_aa_tab_clear(J, tab, tab)) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** Or a NEWREF may rehash the table and move unrelated number keys.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      } else {
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	if (irt_isnum(key->t) && J->chain[IR_NEWREF] > tab)
	  goto cselim;
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      /* Simplified here: let loop_unroll() figure out any type instability. */
      if (ir->o == IR_TNEW) {
	return TREF_NIL;
      } else {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	if (tvispri(tv))
	  return TREF_PRI(itype2irt(tv));
	else if (tvisnum(tv))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (tvisint(tv))
	  return lj_ir_kint(J, intV(tv));
	else if (tvisgcv(tv))
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}